

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventloop-factory.c
# Opt level: O0

int aura_eventloop_module_select(char *name)

{
  int iVar1;
  list_head *__mptr_1;
  list_head *__mptr;
  aura_eventloop_module *pos;
  char *name_local;
  
  __mptr = loops.next + -1;
  while( true ) {
    if (__mptr == &transports) {
      return -5;
    }
    iVar1 = strcmp((char *)__mptr->next,name);
    if (iVar1 == 0) break;
    __mptr = __mptr[1].next + -1;
  }
  if ((current_loop_module != (aura_eventloop_module *)0x0) && (current_loop_module->usage != 0)) {
    slog(0,3,"Using multiple eventloop modules in the same application is a bad idea");
  }
  current_loop_module = (aura_eventloop_module *)__mptr;
  return 0;
}

Assistant:

int aura_eventloop_module_select(const char *name)
{
	struct aura_eventloop_module *pos;

	list_for_each_entry(pos, &loops, linkage)
	if (strcmp(pos->name, name) == 0) {
		if (current_loop_module && current_loop_module->usage)
			slog(0, SLOG_WARN, "Using multiple eventloop modules in the same application is a bad idea");
		current_loop_module = pos;
		return 0;
	}

	return -EIO;
}